

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gate.c
# Opt level: O2

int gate_segment_mix(mixed_segment *segment)

{
  uint uVar1;
  float fVar2;
  undefined8 *puVar3;
  mixed_buffer *buffer;
  mixed_buffer *buffer_00;
  uint32_t i;
  ulong uVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [64];
  uint32_t samples;
  float local_50;
  float local_4c;
  uint local_48;
  float local_44;
  float local_40;
  float local_3c;
  float *in;
  float *local_30;
  
  puVar3 = (undefined8 *)segment->data;
  uVar1 = *(uint *)(puVar3 + 5);
  local_3c = *(float *)(puVar3 + 2);
  local_40 = *(float *)((long)puVar3 + 0x14);
  local_44 = *(float *)(puVar3 + 3);
  local_48 = *(uint *)((long)puVar3 + 0x1c);
  local_4c = *(float *)(puVar3 + 4);
  samples = 0xffffffff;
  local_50 = (float)(1.0 / (double)*(uint *)((long)puVar3 + 0x24));
  buffer = (mixed_buffer *)*puVar3;
  buffer_00 = (mixed_buffer *)puVar3[1];
  mixed_buffer_request_read(&in,&samples,buffer);
  if (buffer == buffer_00) {
    fVar5 = 1.0;
    auVar7 = ZEXT464(uVar1);
    for (uVar4 = 0; fVar6 = auVar7._0_4_, samples != uVar4; uVar4 = uVar4 + 1) {
      fVar2 = in[uVar4];
      switch(*(undefined4 *)((long)puVar3 + 0x2c)) {
      case 1:
        fVar5 = 0.0;
        if (local_40 <= fVar2) {
          *(undefined4 *)((long)puVar3 + 0x2c) = 2;
LAB_001391c8:
          fVar5 = 0.0;
          auVar7 = ZEXT1664(ZEXT816(0) << 0x40);
        }
        break;
      case 2:
        if (fVar6 <= local_44) {
          fVar5 = fVar6 / local_44;
          auVar7 = ZEXT464((uint)(fVar6 + local_50));
        }
        else {
LAB_00139195:
          *(undefined4 *)((long)puVar3 + 0x2c) = 3;
        }
        break;
      case 3:
        if (fVar2 < local_3c) {
          *(undefined4 *)((long)puVar3 + 0x2c) = 4;
          auVar7 = ZEXT464(local_48);
        }
        break;
      case 4:
        if (local_40 <= fVar2) goto LAB_00139195;
        if (fVar6 <= 0.0) {
          *(undefined4 *)((long)puVar3 + 0x2c) = 5;
          auVar7 = ZEXT464((uint)local_4c);
        }
        else {
LAB_00139188:
          auVar7 = ZEXT464((uint)(fVar6 - local_50));
        }
        break;
      case 5:
        if (fVar2 < local_40) {
          if (0.0 < fVar6) {
            fVar5 = fVar6 / local_4c;
            goto LAB_00139188;
          }
          *(undefined4 *)((long)puVar3 + 0x2c) = 1;
          goto LAB_001391c8;
        }
        fVar5 = fVar6 / local_4c;
        auVar7 = ZEXT464((uint)(local_44 * fVar5));
        *(undefined4 *)((long)puVar3 + 0x2c) = 2;
      }
      in[uVar4] = fVar2 * fVar5;
    }
  }
  else {
    mixed_buffer_request_write(&local_30,&samples,buffer_00);
    fVar5 = 1.0;
    auVar7 = ZEXT464(uVar1);
    for (uVar4 = 0; fVar6 = auVar7._0_4_, samples != uVar4; uVar4 = uVar4 + 1) {
      fVar2 = in[uVar4];
      switch(*(undefined4 *)((long)puVar3 + 0x2c)) {
      case 1:
        fVar5 = 0.0;
        if (local_40 <= fVar2) {
          *(undefined4 *)((long)puVar3 + 0x2c) = 2;
LAB_0013907a:
          fVar5 = 0.0;
          auVar7 = ZEXT1664(ZEXT816(0) << 0x40);
        }
        break;
      case 2:
        if (fVar6 <= local_44) {
          fVar5 = fVar6 / local_44;
          auVar7 = ZEXT464((uint)(fVar6 + local_50));
        }
        else {
LAB_00139047:
          *(undefined4 *)((long)puVar3 + 0x2c) = 3;
        }
        break;
      case 3:
        if (fVar2 < local_3c) {
          *(undefined4 *)((long)puVar3 + 0x2c) = 4;
          auVar7 = ZEXT464(local_48);
        }
        break;
      case 4:
        if (local_40 <= fVar2) goto LAB_00139047;
        if (fVar6 <= 0.0) {
          *(undefined4 *)((long)puVar3 + 0x2c) = 5;
          auVar7 = ZEXT464((uint)local_4c);
        }
        else {
LAB_0013903a:
          auVar7 = ZEXT464((uint)(fVar6 - local_50));
        }
        break;
      case 5:
        if (fVar2 < local_40) {
          if (0.0 < fVar6) {
            fVar5 = fVar6 / local_4c;
            goto LAB_0013903a;
          }
          *(undefined4 *)((long)puVar3 + 0x2c) = 1;
          goto LAB_0013907a;
        }
        fVar5 = fVar6 / local_4c;
        auVar7 = ZEXT464((uint)(local_44 * fVar5));
        *(undefined4 *)((long)puVar3 + 0x2c) = 2;
      }
      local_30[uVar4] = fVar2 * fVar5;
    }
    mixed_buffer_finish_read(samples,buffer);
    mixed_buffer_finish_write(samples,buffer_00);
  }
  *(float *)(puVar3 + 5) = fVar6;
  return 1;
}

Assistant:

VECTORIZE int gate_segment_mix(struct mixed_segment *segment){
  struct gate_segment_data *data = (struct gate_segment_data *)segment->data;

  float stime = 1.0/data->samplerate;
  float time = data->time;
  float open = data->open_threshold;
  float close = data->close_threshold;
  float attack = data->attack;
  float hold = data->hold;
  float release = data->release;
  float volume = 1.0;
  
  with_mixed_buffer_transfer(i, samples, in, data->in, out, data->out, {
      float sample = in[i];
      switch(data->state){
      case CLOSED:
        volume = 0.0;
        if(open <= sample){
          time = 0.0;
          data->state = ATTACKING;
        }
        break;
      case ATTACKING:
        if(attack < time){
          data->state = OPEN;
        }else{
          volume = time/attack;
          time += stime;
        }
        break;
      case OPEN:
        if(sample < close){
          time = hold;
          data->state = HOLDING;
        }
        break;
      case HOLDING:
        if(open <= sample){
          data->state = OPEN;
        }else if(time <= 0){
          time = release;
          data->state = RELEASING;
        }else{
          time -= stime;
        }
        break;
      case RELEASING:
        if(open <= sample){
          volume = time/release;
          time = time/release*attack;
          data->state = ATTACKING;
        }else if(time <= 0){
          volume = 0.0;
          time = 0.0;
          data->state = CLOSED;
        }else{
          volume = time/release;
          time -= stime;
        }
        break;
      }
      out[i] = sample * volume;
    })
  data->time = time;
  return 1;
}